

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

leaf_t * containerptr_roaring64_bitmap_remove
                   (roaring64_bitmap_t *r,uint8_t *high48,uint16_t low16,leaf_t *leaf)

{
  int iVar1;
  undefined8 in_RAX;
  int *c;
  art_val_t *__ptr;
  int *piVar2;
  long lVar3;
  uint8_t uVar4;
  uint8_t typecode2;
  uint8_t local_31;
  
  local_31 = (uint8_t)((ulong)in_RAX >> 0x38);
  if (leaf != (leaf_t *)0x0) {
    piVar2 = (int *)leaf->container;
    uVar4 = leaf->typecode;
    c = (int *)container_remove(piVar2,low16,uVar4,&local_31);
    if (c != piVar2) {
      container_free(piVar2,uVar4);
      leaf->container = c;
      leaf->typecode = local_31;
    }
    piVar2 = c;
    uVar4 = local_31;
    if (local_31 == '\x04') {
      uVar4 = (uint8_t)c[2];
      piVar2 = *(int **)c;
    }
    iVar1 = *piVar2;
    if ((uVar4 == '\x03') || (uVar4 == '\x02')) {
      if (0 < iVar1) {
        return leaf;
      }
    }
    else if (iVar1 != 0) {
      if (iVar1 != -1) {
        return leaf;
      }
      lVar3 = 0;
      do {
        if (*(long *)(*(long *)(piVar2 + 2) + lVar3 * 8) != 0) {
          return leaf;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x400);
    }
    container_free(c,local_31);
    __ptr = art_erase(&r->art,high48);
    if (__ptr != (art_val_t *)0x0) {
      roaring_free(__ptr);
    }
  }
  return (leaf_t *)0x0;
}

Assistant:

static inline leaf_t *containerptr_roaring64_bitmap_remove(
    roaring64_bitmap_t *r, uint8_t *high48, uint16_t low16, leaf_t *leaf) {
    if (leaf == NULL) {
        return NULL;
    }

    container_t *container = leaf->container;
    uint8_t typecode = leaf->typecode;
    uint8_t typecode2;
    container_t *container2 =
        container_remove(container, low16, typecode, &typecode2);
    if (container2 != container) {
        container_free(container, typecode);
        leaf->container = container2;
        leaf->typecode = typecode2;
    }
    if (!container_nonzero_cardinality(container2, typecode2)) {
        container_free(container2, typecode2);
        leaf = (leaf_t *)art_erase(&r->art, high48);
        if (leaf != NULL) {
            free_leaf(leaf);
        }
        return NULL;
    }
    return leaf;
}